

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::prepareName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingComponentsTest *this,GLchar *name,GLint location,
          GLint component,STAGES stage,STORAGE storage)

{
  size_t position;
  GLchar buffer [16];
  size_t local_58;
  uint local_4c;
  GLchar local_48 [24];
  
  local_4c = component;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"PREFIXNAME_lLOCATION_cCOMPONENT",
             (allocator<char> *)&local_58);
  local_58 = 0;
  Utils::replaceToken("PREFIX",&local_58,
                      Utils::ProgramInterface::GetStagePrefix::lut[stage][storage],
                      __return_storage_ptr__);
  Utils::replaceToken("NAME",&local_58,name,__return_storage_ptr__);
  sprintf(local_48,"%d",(ulong)(uint)location);
  Utils::replaceToken("LOCATION",&local_58,local_48,__return_storage_ptr__);
  sprintf(local_48,"%d",(ulong)local_4c);
  Utils::replaceToken("COMPONENT",&local_58,local_48,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingComponentsTest::prepareName(const glw::GLchar* name, glw::GLint location, glw::GLint component,
											   Utils::Shader::STAGES stage, Utils::Variable::STORAGE storage)
{
	GLchar		  buffer[16];
	std::string   result   = "PREFIXNAME_lLOCATION_cCOMPONENT";
	size_t		  position = 0;
	const GLchar* prefix   = Utils::ProgramInterface::GetStagePrefix(stage, storage);

	Utils::replaceToken("PREFIX", position, prefix, result);
	Utils::replaceToken("NAME", position, name, result);

	sprintf(buffer, "%d", location);
	Utils::replaceToken("LOCATION", position, buffer, result);

	sprintf(buffer, "%d", component);
	Utils::replaceToken("COMPONENT", position, buffer, result);

	return result;
}